

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall
MODEL3D::three_dim_model::add_right_plane
          (three_dim_model *this,int *n,int *gain,int *depth,
          map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
          *lines_map,
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *curve_loops_map,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *plane_surfaces_map,int *base_points_count,int *panel_count,
          vector<int,_std::allocator<int>_> *roof_line_vector,int *prev_cl_count,int *prev_pls_count
          ,int *prev_pnt_count)

{
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  *p_Var1;
  uint uVar2;
  _Rb_tree_color _Var3;
  _Rb_tree_iterator<std::pair<const_int,_GEO::line>_> _Var4;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> _Var5;
  _Rb_tree_iterator<std::pair<const_int,_int>_> _Var6;
  _Base_ptr p_Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  _Rb_tree_color _Var12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  int line_count;
  allocator_type local_d9;
  undefined1 local_d8 [8];
  _Vector_base<int,_std::allocator<int>_> _Stack_d0;
  undefined8 local_b8;
  int local_b0;
  ulong local_a8;
  int local_9c;
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  *local_98;
  ulong local_90;
  int local_84;
  int *local_80;
  ulong local_78;
  three_dim_model *local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = (_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)lines_map;
  local_80 = n;
  _Var4 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,GEO::line>>>
                    ((_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>)
                     &(lines_map->_M_t)._M_impl.super__Rb_tree_header,1);
  line_count = _Var4._M_node[1]._M_color;
  p_Var7 = (_Base_ptr)prev_cl_count;
  if ((curve_loops_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    _Var5 = std::
            prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                      ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                        )&(curve_loops_map->_M_t)._M_impl.super__Rb_tree_header,1);
    p_Var7 = _Var5._M_node + 1;
  }
  _Var12 = p_Var7->_M_color;
  p_Var7 = (_Base_ptr)prev_pls_count;
  if ((plane_surfaces_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    _Var6 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,int>>>
                      ((_Rb_tree_iterator<std::pair<const_int,_int>_>)
                       &(plane_surfaces_map->_M_t)._M_impl.super__Rb_tree_header,1);
    p_Var7 = _Var6._M_node + 1;
  }
  _Var3 = p_Var7->_M_color;
  iVar10 = 0;
  local_70 = (three_dim_model *)depth;
  local_50 = (_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)curve_loops_map;
  while (p_Var1 = local_98, local_a8 = (ulong)_Var3, iVar10 != 6) {
    iVar15 = *local_80;
    iVar9 = *(int *)&(local_70->polygons_map)._M_t._M_impl;
    iVar8 = *panel_count * iVar9;
    iVar14 = iVar8 + *prev_pnt_count + *base_points_count + 1;
    uVar2 = *prev_pnt_count + *base_points_count + iVar8;
    local_48 = (ulong)uVar2;
    iVar9 = iVar9 + uVar2 + 1;
    line_count = line_count + 1;
    _Stack_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar14;
    local_d8._4_4_ = iVar15;
    local_d8._0_4_ = line_count;
    local_84 = iVar10;
    local_78 = (ulong)_Var12;
    std::
    _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
    ::_M_insert_unique<std::pair<int_const,GEO::line>>
              (local_98,(pair<const_int,_GEO::line> *)local_d8);
    line_count = line_count + 1;
    _Stack_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar9;
    local_d8._4_4_ = iVar14;
    local_d8._0_4_ = line_count;
    std::
    _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
    ::_M_insert_unique<std::pair<int_const,GEO::line>>
              (p_Var1,(pair<const_int,_GEO::line> *)local_d8);
    line_count = line_count + 1;
    local_d8._0_4_ = line_count;
    local_d8._4_4_ = iVar9;
    _Stack_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar15;
    std::
    _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
    ::_M_insert_unique<std::pair<int_const,GEO::line>>
              (p_Var1,(pair<const_int,_GEO::line> *)local_d8);
    local_b8 = CONCAT44(line_count + -1,line_count + -2);
    local_b0 = line_count;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_b8;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_68,__l,&local_d9);
    uVar13 = local_78;
    iVar10 = (int)local_78 + 1;
    local_d8._0_4_ = iVar10;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&_Stack_d0,
               (vector<int,_std::allocator<int>_> *)&local_68);
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
    ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                *)curve_loops_map,
               (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_d8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_d0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    local_d8._0_4_ = (int)local_a8 + 1;
    local_d8._4_4_ = iVar10;
    std::
    _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
    ::_M_insert_unique<std::pair<int_const,int>>
              ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                *)plane_surfaces_map,(pair<const_int,_int> *)local_d8);
    local_90 = 0;
    iVar10 = 0;
    while( true ) {
      p_Var1 = local_98;
      iVar15 = *(int *)&(local_70->polygons_map)._M_t._M_impl;
      if (iVar15 <= iVar10 + 1) break;
      iVar9 = (int)local_48;
      uVar2 = iVar10 + iVar9 + 1;
      local_40 = (ulong)(uint)(iVar9 + iVar10);
      iVar8 = iVar9 + 2 + iVar10;
      uVar11 = iVar15 + iVar9 + iVar10 + 2;
      line_count = line_count + 1;
      _Stack_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar8;
      local_d8._4_4_ = uVar2;
      local_d8._0_4_ = line_count;
      local_9c = iVar10 + 1;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
      ::_M_insert_unique<std::pair<int_const,GEO::line>>
                (local_98,(pair<const_int,_GEO::line> *)local_d8);
      line_count = line_count + 1;
      _Stack_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar11;
      local_d8._4_4_ = iVar8;
      local_d8._0_4_ = line_count;
      local_38 = (ulong)uVar11;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
      ::_M_insert_unique<std::pair<int_const,GEO::line>>
                (p_Var1,(pair<const_int,_GEO::line> *)local_d8);
      if (local_9c == *(int *)&(local_70->polygons_map)._M_t._M_impl + -1) {
        std::vector<int,_std::allocator<int>_>::push_back(roof_line_vector,&line_count);
      }
      uVar13 = local_38;
      p_Var1 = local_98;
      uVar11 = iVar15 + (int)local_40 + 1;
      line_count = line_count + 1;
      unique0x00004a80 = (line)(local_38 + ((ulong)uVar2 << 0x20));
      local_d8._0_4_ = line_count;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
      ::_M_insert_unique<std::pair<int_const,GEO::line>>
                (local_98,(pair<const_int,_GEO::line> *)local_d8);
      line_count = line_count + 1;
      register0x00000000 = (line)((ulong)uVar11 << 0x20 | uVar13);
      local_d8._0_4_ = line_count;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
      ::_M_insert_unique<std::pair<int_const,GEO::line>>
                (p_Var1,(pair<const_int,_GEO::line> *)local_d8);
      line_count = line_count + 1;
      local_d8._0_4_ = line_count;
      local_d8._4_4_ = uVar11;
      _Stack_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar2;
      std::
      _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
      ::_M_insert_unique<std::pair<int_const,GEO::line>>
                (p_Var1,(pair<const_int,_GEO::line> *)local_d8);
      local_b8 = CONCAT44(line_count + -3,line_count + -4);
      local_b0 = line_count + -2;
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)&local_b8;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68,__l_00,&local_d9);
      uVar13 = local_78;
      iVar10 = (int)local_78;
      iVar15 = (int)local_90;
      iVar9 = iVar10 + iVar15 + 2;
      local_d8._0_4_ = iVar9;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&_Stack_d0,
                 (vector<int,_std::allocator<int>_> *)&local_68);
      curve_loops_map =
           (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            *)local_50;
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
      ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                (local_50,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_d8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_d0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
      local_d8._0_4_ = (int)local_a8 + iVar15 + 2;
      local_d8._4_4_ = iVar9;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_insert_unique<std::pair<int_const,int>>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)plane_surfaces_map,(pair<const_int,_int> *)local_d8);
      local_b8 = CONCAT44(line_count + -1,2 - line_count);
      local_b0 = line_count;
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)&local_b8;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68,__l_01,&local_d9);
      iVar10 = iVar15 + iVar10 + 3;
      local_d8._0_4_ = iVar10;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&_Stack_d0,
                 (vector<int,_std::allocator<int>_> *)&local_68);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
      ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                  *)curve_loops_map,
                 (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_d8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_d0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
      iVar15 = (int)local_90;
      local_d8._0_4_ = (int)local_a8 + iVar15 + 3;
      local_d8._4_4_ = iVar10;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_insert_unique<std::pair<int_const,int>>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)plane_surfaces_map,(pair<const_int,_int> *)local_d8);
      local_90 = (ulong)(iVar15 + 2);
      iVar10 = local_9c;
    }
    *panel_count = *panel_count + 1;
    _Var3 = (int)local_a8 + (int)local_90 + _S_black;
    _Var12 = (int)uVar13 + (int)local_90 + _S_black;
    iVar10 = local_84 + 1;
  }
  add_normal_plane(local_70,local_80,panel_count,(int *)local_70,
                   (map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                    *)local_98,curve_loops_map,plane_surfaces_map,base_points_count,panel_count,
                   roof_line_vector,prev_cl_count,prev_pls_count,prev_pnt_count);
  return;
}

Assistant:

void MODEL3D::three_dim_model::add_right_plane(
int &n, int &gain, int &depth,
std::map<int, GEO::line> &lines_map,
std::map<int, std::vector<int>> &curve_loops_map,
std::map<int, int> &plane_surfaces_map,
const int &base_points_count,
int &panel_count,
std::vector<int> &roof_line_vector,
const int &prev_cl_count,
const int &prev_pls_count,
const int &prev_pnt_count)
{
    // Setting up the counter values ========================================
    int line_count = std::prev(lines_map.end(),1)->first;
    int curve_loop_count;
    if (!curve_loops_map.empty())
        curve_loop_count = std::prev(curve_loops_map.end(),1)->first;
    else
        curve_loop_count = prev_cl_count;
    int plane_surfaces_count;
    if(!plane_surfaces_map.empty())
        plane_surfaces_count = std::prev(plane_surfaces_map.end(),1)->first;
    else
        plane_surfaces_count = prev_pls_count;
    // Loop through six panels
    for ( int corner_cnt = 0; corner_cnt < 6; corner_cnt++)
    {
        // Creating the ground-level plane surface ===============================
        //c<--b
        //v + ^                             <-- Loop to form plane surface
        //d-->a
        GEO::line a, b, c, d, diag;
        a.start = n;                        // initial point of plane surface
        a.end   = base_points_count + 1 + prev_pnt_count + depth * panel_count;
        b.start = a.end;
        b.end   = b.start + depth;
        c.start = b.end;
        c.end   = a.start;
        lines_map.insert({++line_count, a});
        lines_map.insert({++line_count, b});
        lines_map.insert({++line_count, c});
        curve_loops_map.insert(
        {++curve_loop_count,
        {line_count-2, line_count-1,
        line_count} } );
        plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
        // Creating the higher plane surfaces ===============================
        for ( int level_deep = 1; level_deep < depth; level_deep++)
        {
            a.start           = a.end;
            a.end          = a.end + 1;
            b.start           = a.end;
            b.end          = b.start + depth;
            c.start          = b.end;
            c.end           = c.start - 1;
            d.start          = c.end;
            d.end           = a.start;
            diag.start       = b.end;
            diag.end        = a.start;
            lines_map.insert({++line_count, a});
            lines_map.insert({++line_count, b});
            if(level_deep==(depth-1))
                roof_line_vector.push_back(line_count);
            lines_map.insert({++line_count, diag});
            lines_map.insert({++line_count, c});
            lines_map.insert({++line_count, d});
            curve_loops_map.insert( {++curve_loop_count,
                                    {(line_count-4), (line_count-3), (line_count-2)} } );
            plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
            curve_loops_map.insert( {++curve_loop_count,
                                    {(-1*(line_count-2)), (line_count-1), (line_count)} } );
            plane_surfaces_map.insert({++plane_surfaces_count, curve_loop_count});
        }
        panel_count++;
    }
    //treat the follow-up panel as a normal plane
    add_normal_plane(   n, gain, depth,
                        lines_map,
                        curve_loops_map,
                        plane_surfaces_map,
                        base_points_count,
                        panel_count,
                        roof_line_vector,
                        prev_cl_count,
                        prev_pls_count,
                        prev_pnt_count);
}